

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

string * __thiscall wasm::Struct::toString_abi_cxx11_(string *__return_storage_ptr__,Struct *this)

{
  Struct *this_local;
  
  genericToString<wasm::Struct>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::string Struct::toString() const { return genericToString(*this); }